

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O0

void __thiscall
FIX::TimeRange::TimeRange
          (TimeRange *this,LocalTimeOnly *startTime,LocalTimeOnly *endTime,int startDay,int endDay)

{
  bool bVar1;
  int endDay_local;
  int startDay_local;
  LocalTimeOnly *endTime_local;
  LocalTimeOnly *startTime_local;
  TimeRange *this_local;
  
  UtcTimeOnly::UtcTimeOnly(&this->m_startTime,&startTime->super_DateTime);
  UtcTimeOnly::UtcTimeOnly(&this->m_endTime,&endTime->super_DateTime);
  this->m_startDay = startDay;
  this->m_endDay = endDay;
  this->m_useLocalTime = true;
  if ((((0 < startDay) && (0 < endDay)) && (startDay == endDay)) &&
     (bVar1 = operator>(&endTime->super_DateTime,&startTime->super_DateTime), bVar1)) {
    UtcTimeOnly::operator=(&this->m_endTime,&this->m_startTime);
  }
  return;
}

Assistant:

TimeRange::TimeRange(const LocalTimeOnly &startTime, const LocalTimeOnly &endTime, int startDay, int endDay)
    : m_startTime(startTime),
      m_endTime(endTime),
      m_startDay(startDay),
      m_endDay(endDay),
      m_useLocalTime(true) {
  if (startDay > 0 && endDay > 0 && startDay == endDay && endTime > startTime) {
    m_endTime = m_startTime;
  }
}